

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFunctionDecPOMDPDiscrete.cpp
# Opt level: O0

double __thiscall
ValueFunctionDecPOMDPDiscrete::CalculateVsjohRecursively<false>
          (ValueFunctionDecPOMDPDiscrete *this,Index sI,Index johI,Index stage)

{
  Index johI_00;
  Index IVar1;
  JointPolicyDiscretePure *pJVar2;
  Index in_ECX;
  uint in_EDX;
  undefined4 in_ESI;
  ValueFunctionDecPOMDPDiscrete *in_RDI;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double val;
  bool valid;
  double thisSucV;
  Index sucJohI;
  double probJOI;
  Index joI;
  double probSucSI;
  Index sucSI;
  double ExpFutureR;
  double R;
  Index jaI;
  PlanningUnitDecPOMDPDiscrete *in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  uint local_44;
  uint local_34;
  double dVar8;
  PlanningUnitMADPDiscrete *local_8;
  
  IVar1 = (Index)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
  pJVar2 = GetJPol(in_RDI);
  johI_00 = (*(pJVar2->super_JointPolicyDiscrete).super_JointPolicy._vptr_JointPolicy[0x11])
                      (pJVar2,(ulong)in_EDX);
  local_8 = (PlanningUnitMADPDiscrete *)
            PlanningUnitDecPOMDPDiscrete::GetReward
                      (in_stack_ffffffffffffff90,(Index)((ulong)in_RDI >> 0x20),(Index)in_RDI);
  dVar8 = 0.0;
  IVar1 = PlanningUnitMADPDiscrete::GetTimeStepForJOHI
                    ((PlanningUnitMADPDiscrete *)
                     CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),IVar1);
  if ((ulong)IVar1 < in_RDI->_m_h - 1) {
    for (local_34 = 0; (ulong)local_34 < in_RDI->_m_nrS; local_34 = local_34 + 1) {
      dVar3 = PlanningUnitMADPDiscrete::GetTransitionProbability
                        (&in_stack_ffffffffffffff90->super_PlanningUnitMADPDiscrete,
                         (Index)((ulong)in_RDI >> 0x20),(Index)in_RDI,0);
      for (local_44 = 0; (ulong)local_44 < in_RDI->_m_nrJO; local_44 = local_44 + 1) {
        dVar4 = PlanningUnitMADPDiscrete::GetObservationProbability
                          (&in_stack_ffffffffffffff90->super_PlanningUnitMADPDiscrete,
                           (Index)((ulong)in_RDI >> 0x20),(Index)in_RDI,0);
        PlanningUnitMADPDiscrete::GetSuccessorJOHI
                  (local_8,(Index)((ulong)dVar8 >> 0x20),SUB84(dVar8,0));
        auVar5._0_8_ = CalculateVsjohRecursively<false>
                                 ((ValueFunctionDecPOMDPDiscrete *)CONCAT44(in_ESI,in_EDX),in_ECX,
                                  johI_00,(Index)((ulong)local_8 >> 0x20));
        auVar5._8_8_ = 0;
        auVar7._8_8_ = 0;
        auVar7._0_8_ = dVar8;
        auVar6._8_8_ = 0;
        auVar6._0_8_ = dVar3 * dVar4;
        auVar5 = vfmadd213sd_fma(auVar5,auVar6,auVar7);
        dVar8 = auVar5._0_8_;
      }
    }
    local_8 = (PlanningUnitMADPDiscrete *)((double)local_8 + dVar8);
  }
  return (double)local_8;
}

Assistant:

double ValueFunctionDecPOMDPDiscrete::CalculateVsjohRecursively(Index sI,Index johI, Index stage)
{
#if DEBUG_CALCV
    std::cout<< "\nValueFunctionDecPOMDPDiscrete::CalculateVsjohRecursively("
             << sI << ", " << johI << ") called"<<std::endl;
#endif

    Index jaI = GetJPol()->GetJointActionIndex(johI);
    double R = _m_pu->GetReward(sI, jaI);
    double ExpFutureR = 0.0;
    // horizon h policy makes decision on observation histories which 
    // maximally have length h-1. 
    // t=0 - () - length=0 
    // ... 
    // t=h-1 - (o1,...,o{h-1}) - length h-1
    if( ( CACHED && stage >= _m_h - 1) ||
        (!CACHED && _m_pu->GetTimeStepForJOHI(johI) >= _m_h - 1 ) )
    {
#if DEBUG_CALCV
        std::cout << "ValueFunctionDecPOMDPDiscrete::CalculateVsjoh"
                  << "Recursively("<< sI <<", " << johI << ") - V="<<R<<std::endl;
#endif
        return(R);
    }

#if DEBUG_CALCV
    std::cout << "Calculating future reward"<<std::endl;
#endif
    for(Index sucSI = 0; sucSI < _m_nrS; sucSI++)
    {
        double probSucSI = _m_pu->GetTransitionProbability(sI, jaI,sucSI);
#if DEBUG_CALCV
        std::cout << "P(s"<<sucSI<<"|s"<<sI<<",ja"<<jaI<<")="<<probSucSI<<std::endl;
#endif

        for(Index joI = 0; joI < _m_nrJO; joI++)
        {
            double probJOI =  _m_pu->GetObservationProbability(jaI, sucSI, joI);
#if DEBUG_CALCV
            std::cout << "P(jo"<<joI<<"|ja"<<jaI<<",s"<<sucSI<<")="<<probJOI<<std::endl;
#endif
            Index sucJohI = _m_pu->GetSuccessorJOHI(johI, joI);

            double thisSucV;
            bool valid=false;
            if (CACHED)
                thisSucV=GetCached(sucSI,sucJohI,valid); // read from cache
            if (!valid) // if not found in cache or cache is not used
                thisSucV=CalculateVsjohRecursively<CACHED>(sucSI,sucJohI,stage+1);
            ExpFutureR += probSucSI * probJOI * thisSucV;
        }//end for each observation
    }//end for each potential succesor state
    double val = R + ExpFutureR;
    if (CACHED)
        SetCached(sI, johI, val); // write to cache
#if DEBUG_CALCV
    std::cout << "ValueFunctionDecPOMDPDiscrete::CalculateVsjohRecursively("
              << sI <<", " << johI << ") \n->immediate R="<<R
              << " \n->exp. future reward="<<ExpFutureR<<"\n->V="<<val<<std::endl;
#endif
    return(val);
}